

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

int dmrC_test_allocator(void)

{
  char *pcVar1;
  char *__ptr;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  void **p;
  void **p_1;
  undefined1 auStack_a8 [8];
  allocator alloc2;
  undefined1 local_60 [8];
  allocator alloc;
  
  local_60 = (undefined1  [8])0x1371b2;
  alloc.name_ = (char *)0x0;
  alloc.blobs_ = (allocation_blob *)0x8;
  alloc.size_ = 0x2800000004;
  alloc.alignment_ = 0;
  alloc.chunking_ = 0;
  alloc.freelist_ = (void *)0x0;
  alloc.allocations = 0;
  alloc.total_bytes = 0;
  puVar2 = (undefined8 *)dmrC_allocator_allocate((allocator *)local_60,0);
  iVar5 = 1;
  if ((((puVar2 != (undefined8 *)0x0) && ((int)alloc.size_ == 4)) &&
      (alloc.freelist_ == (void *)0x1)) &&
     ((alloc._24_8_ == 0 &&
      (puVar3 = (undefined8 *)dmrC_allocator_allocate((allocator *)local_60,0), puVar3 == puVar2 + 1
      )))) {
    *puVar2 = alloc._24_8_;
    *puVar3 = puVar2;
    alloc._24_8_ = puVar3;
    puVar4 = (undefined8 *)dmrC_allocator_allocate((allocator *)local_60,0);
    if ((puVar4 == puVar3) &&
       ((puVar3 = (undefined8 *)dmrC_allocator_allocate((allocator *)local_60,0), puVar3 == puVar2
        && (dmrC_allocator_allocate((allocator *)local_60,0), pcVar1 = alloc.name_,
           alloc.allocations == 0x50)))) {
      alloc2.allocations = 0;
      alloc2.total_bytes = 0;
      alloc2.alignment_ = 0;
      alloc2.chunking_ = 0;
      alloc2.freelist_ = (void *)0x0;
      alloc2.blobs_ = (allocation_blob *)0x0;
      alloc2.size_ = 0;
      auStack_a8 = (undefined1  [8])0x0;
      alloc2.name_ = (char *)0x0;
      dmrC_allocator_transfer((allocator *)local_60,(allocator *)auStack_a8);
      __ptr = alloc2.name_;
      iVar5 = 1;
      if ((alloc.name_ == (char *)0x0) && (alloc2.name_ == pcVar1)) {
        alloc2.name_ = (char *)0x0;
        alloc2.alignment_ = 0;
        alloc2.chunking_ = 0;
        alloc2.freelist_ = (void *)0x0;
        alloc2.allocations = 0;
        alloc2.total_bytes = 0;
        alloc.name_ = (char *)0x0;
        while (__ptr != (char *)0x0) {
          pcVar1 = *(char **)__ptr;
          free(__ptr);
          __ptr = pcVar1;
        }
        alloc2.name_ = (char *)0x0;
        alloc2.allocations = 0;
        alloc2.total_bytes = 0;
        alloc2.alignment_ = 0;
        alloc2.chunking_ = 0;
        alloc2.freelist_ = (void *)0x0;
        puts("allocator tests okay");
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int dmrC_test_allocator() {
  struct allocator alloc;
  dmrC_allocator_init(&alloc, "foo", sizeof(struct foo), __alignof__(struct foo),
                 sizeof(struct allocation_blob) + sizeof(struct foo) * 2);
  struct foo *t1 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t1 == NULL)
    return 1;
  if (alloc.alignment_ != __alignof__(struct foo))
    return 1;
  if (alloc.allocations != 1)
    return 1;
  if (alloc.freelist_ != NULL)
    return 1;
  struct foo *t2 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t2 != t1 + 1)
    return 1;
  //dmrC_allocator_show_allocations(&alloc);
  dmrC_allocator_free(&alloc, t1);
  dmrC_allocator_free(&alloc, t2);
  struct foo *t3 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t3 != t2)
    return 1;
  struct foo *t4 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t4 != t1)
    return 1;
  struct foo *t5 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  (void)t5;
  if (alloc.total_bytes !=
      (sizeof(struct allocation_blob) + sizeof(struct foo) * 2) * 2)
    return 1;
  struct allocator alloc2;
  memset(&alloc2, 0, sizeof alloc2);
  struct allocation_blob *saved = alloc.blobs_;
  dmrC_allocator_transfer(&alloc, &alloc2);
  if (alloc.blobs_ != NULL)
	  return 1;
  if (alloc2.blobs_ != saved)
	  return 1;
  dmrC_allocator_destroy(&alloc2);
  printf("allocator tests okay\n");
  return 0;
}